

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.c
# Opt level: O0

void * coll_deque_remove_at(coll_deque_t *deque,size_t index)

{
  size_t p;
  void *data;
  size_t pos;
  size_t index_local;
  coll_deque_t *deque_local;
  
  if ((deque == (coll_deque_t *)0x0) || (deque->len <= index)) {
    deque_local = (coll_deque_t *)0x0;
  }
  else {
    p = index_to_pos(deque,index);
    deque_local = (coll_deque_t *)deque->data[p];
    if (index < deque->len >> 1) {
      coll_deque_release(deque,p,true);
    }
    else {
      coll_deque_release(deque,p,false);
    }
    deque->len = deque->len - 1;
  }
  return deque_local;
}

Assistant:

void *coll_deque_remove_at(coll_deque_t *deque, size_t index) {
    if (!deque || index >= deque->len) {
        return NULL;
    }

    size_t pos = index_to_pos(deque, index);
    void *data = deque->data[pos];

    if (index < deque->len / 2) {
        coll_deque_release(deque, pos, true);
    } else {
        coll_deque_release(deque, pos, false);
    }
    --(deque->len);
    return data;
}